

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O2

int has_ext(char *ext)

{
  char **ppcVar1;
  int iVar2;
  byte *pbVar3;
  size_t sVar4;
  byte *pbVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  byte *__haystack;
  
  ppcVar1 = exts_i;
  if (max_loaded_major < 3) {
    iVar6 = 0;
    __haystack = (byte *)exts;
    if (ext != (char *)0x0 && exts != (char *)0x0) {
      do {
        pbVar3 = (byte *)strstr((char *)__haystack,ext);
        if (pbVar3 == (byte *)0x0) {
          return 0;
        }
        sVar4 = strlen(ext);
        pbVar5 = pbVar3 + sVar4;
      } while (((pbVar3 != __haystack) && (__haystack = pbVar5, pbVar3[-1] != 0x20)) ||
              (__haystack = pbVar5, (*pbVar5 & 0xdf) != 0));
LAB_0016cfc5:
      iVar6 = 1;
    }
  }
  else if (exts_i == (char **)0x0) {
    iVar6 = 0;
  }
  else {
    iVar6 = 0;
    uVar7 = (ulong)(uint)num_exts_i;
    if (num_exts_i < 1) {
      uVar7 = 0;
    }
    for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      if ((ppcVar1[uVar8] != (char *)0x0) && (iVar2 = strcmp(ppcVar1[uVar8],ext), iVar2 == 0))
      goto LAB_0016cfc5;
    }
  }
  return iVar6;
}

Assistant:

static int has_ext(const char *ext) {
#ifdef _GLAD_IS_SOME_NEW_VERSION
    if(max_loaded_major < 3) {
#endif
        const char *extensions;
        const char *loc;
        const char *terminator;
        extensions = exts;
        if(extensions == NULL || ext == NULL) {
            return 0;
        }

        while(1) {
            loc = strstr(extensions, ext);
            if(loc == NULL) {
                return 0;
            }

            terminator = loc + strlen(ext);
            if((loc == extensions || *(loc - 1) == ' ') &&
                (*terminator == ' ' || *terminator == '\0')) {
                return 1;
            }
            extensions = terminator;
        }
#ifdef _GLAD_IS_SOME_NEW_VERSION
    } else {
        int index;
        if(exts_i == NULL) return 0;
        for(index = 0; index < num_exts_i; index++) {
            const char *e = exts_i[index];

            if(exts_i[index] != NULL && strcmp(e, ext) == 0) {
                return 1;
            }
        }
    }
#endif

    return 0;
}